

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checked_test.cpp
# Opt level: O3

void __thiscall
CheckedMutexTest_InvalidUnlock1_Test<yamc::checked::timed_mutex>::TestBody
          (CheckedMutexTest_InvalidUnlock1_Test<yamc::checked::timed_mutex> *this)

{
  bool *pbVar1;
  element_type *peVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  char *pcVar6;
  StringLike<const_char_*> *regex;
  element_type *peVar7;
  DeathTest *gtest_dt;
  TypeParam mtx;
  element_type *local_f0;
  PolymorphicMatcher<testing::internal::MatchesRegexMatcher> local_e8;
  undefined8 uStack_d0;
  AssertHelper local_c0 [4];
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a0;
  mutex_base local_88;
  
  yamc::checked::timed_mutex::timed_mutex((timed_mutex *)&local_88);
  pbVar1 = &local_e8.impl_.full_match_;
  local_e8.impl_.full_match_ = false;
  local_e8.impl_._17_7_ = 0;
  uStack_d0 = 0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::mutex_base::lock(&local_88);
  }
  if (local_e8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_e8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  local_e8.impl_.full_match_ = false;
  local_e8.impl_._17_7_ = 0;
  uStack_d0 = 0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_e8.impl_.regex_.super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)pbVar1;
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    yamc::checked::detail::mutex_base::unlock(&local_88);
  }
  if (local_e8.impl_.regex_.
      super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)pbVar1) {
    operator_delete(local_e8.impl_.regex_.
                    super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr);
  }
  bVar3 = testing::internal::AlwaysTrue();
  if (bVar3) {
    local_c0[0].data_ = (AssertHelperData *)0x1cec69;
    testing::ContainsRegex<char_const*>(&local_e8,(testing *)local_c0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_a0,(PolymorphicMatcher *)&local_e8);
    if (local_e8.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_e8.impl_.regex_.
                 super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    bVar3 = testing::internal::DeathTest::Create
                      ("mtx.unlock()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a0,
                       "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
                       ,0x68,(DeathTest **)&local_f0);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a0);
    peVar7 = local_f0;
    if (!bVar3) goto LAB_00178cbb;
    if (local_f0 == (element_type *)0x0) goto LAB_00178d11;
    iVar5 = (**(code **)(local_f0->pattern_ + 0x10))(local_f0);
    peVar2 = local_f0;
    if (iVar5 == 0) {
      testing::KilledBySignal::KilledBySignal((KilledBySignal *)&local_e8,6);
      iVar5 = (**(code **)(local_f0->pattern_ + 0x18))();
      bVar3 = testing::KilledBySignal::operator()((KilledBySignal *)&local_e8,iVar5);
      cVar4 = (**(code **)(peVar2->pattern_ + 0x20))(peVar2,bVar3);
      if (cVar4 == '\0') {
        (**(code **)(peVar7->pattern_ + 8))(peVar7);
        goto LAB_00178cbb;
      }
    }
    else if (iVar5 == 1) {
      bVar3 = testing::internal::AlwaysTrue();
      if (bVar3) {
        yamc::checked::detail::mutex_base::unlock(&local_88);
      }
      (**(code **)(local_f0->pattern_ + 0x28))(local_f0,2);
      (**(code **)(peVar2->pattern_ + 0x28))(peVar2,0);
    }
    pcVar6 = peVar7->pattern_;
  }
  else {
LAB_00178cbb:
    testing::Message::Message((Message *)&local_e8);
    pcVar6 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              (local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/checked_test.cpp"
               ,0x68,pcVar6);
    testing::internal::AssertHelper::operator=(local_c0,(Message *)&local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_c0);
    if (local_e8.impl_.regex_.
        super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) goto LAB_00178d11;
    pcVar6 = (local_e8.impl_.regex_.
              super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             pattern_;
    peVar7 = local_e8.impl_.regex_.
             super___shared_ptr<const_testing::internal::RE,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  (**(code **)(pcVar6 + 8))(peVar7);
LAB_00178d11:
  yamc::checked::timed_mutex::~timed_mutex((timed_mutex *)&local_88);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, InvalidUnlock1) {
  TypeParam mtx;
  ASSERT_NO_THROW(mtx.lock());
  ASSERT_NO_THROW(mtx.unlock());
  EXPECT_CHECK_FAILURE(mtx.unlock());
}